

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

NetType * slang::ast::anon_unknown_0::getDefaultNetType(Scope *scope,SourceLocation location)

{
  bool bVar1;
  Compilation *this;
  Scope *in_RDI;
  NetType *netType;
  Scope *in_stack_00000070;
  SourceLocation in_stack_00000078;
  DiagCode in_stack_00000084;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined8 local_8;
  
  local_8 = Scope::getDefaultNetType
                      ((Scope *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bVar1 = NetType::isError(local_8);
  if (bVar1) {
    Scope::addDiag(in_stack_00000070,in_stack_00000084,in_stack_00000078);
    this = Scope::getCompilation(in_RDI);
    local_8 = Compilation::getWireNetType(this);
  }
  return local_8;
}

Assistant:

const NetType& getDefaultNetType(const Scope& scope, SourceLocation location) {
    auto& netType = scope.getDefaultNetType();
    if (!netType.isError())
        return netType;

    scope.addDiag(diag::ImplicitNetPortNoDefault, location);
    return scope.getCompilation().getWireNetType();
}